

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

void __thiscall
duckdb::IEJoinGlobalSourceState::GetNextPair
          (IEJoinGlobalSourceState *this,ClientContext *client,IEJoinLocalSourceState *lstate)

{
  atomic<unsigned_long> *paVar1;
  value_type vVar2;
  pointer __p;
  reference pvVar3;
  type this_00;
  type this_01;
  idx_t iVar4;
  idx_t iVar5;
  reference pvVar6;
  ulong uVar7;
  unsigned_long b1;
  ClientContext *local_48;
  pointer local_40;
  unsigned_long b2;
  
  local_48 = client;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::get<true>(&this->gsink->tables,0);
  this_00 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
            ::operator*(pvVar3);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::get<true>(&this->gsink->tables,1);
  this_01 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
            ::operator*(pvVar3);
  iVar4 = PhysicalRangeJoin::GlobalSortedTable::BlockCount(this_00);
  iVar5 = PhysicalRangeJoin::GlobalSortedTable::BlockCount(this_01);
  LOCK();
  paVar1 = &this->next_pair;
  uVar7 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if (uVar7 < iVar4 * iVar5) {
    b1 = uVar7 / iVar5;
    uVar7 = uVar7 % iVar5;
    lstate->left_block_index = b1;
    b2 = uVar7;
    pvVar6 = vector<unsigned_long,_true>::get<true>(&this->left_bases,b1);
    lstate->left_base = *pvVar6;
    lstate->right_block_index = uVar7;
    pvVar6 = vector<unsigned_long,_true>::get<true>(&this->right_bases,uVar7);
    lstate->right_base = *pvVar6;
    make_uniq<duckdb::IEJoinUnion,duckdb::ClientContext&,duckdb::PhysicalIEJoin_const&,duckdb::PhysicalRangeJoin::GlobalSortedTable&,unsigned_long_const&,duckdb::PhysicalRangeJoin::GlobalSortedTable&,unsigned_long_const&>
              ((duckdb *)&local_40,local_48,this->op,this_00,&b1,this_01,&b2);
    __p = local_40;
    local_40 = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>::reset
              ((__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_> *)
               &lstate->joiner,__p);
    ::std::unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>::~unique_ptr
              ((unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_> *)
               &local_40);
  }
  else if (((this->left_outers).super___atomic_base<unsigned_long>._M_i != 0) ||
          ((this->right_outers).super___atomic_base<unsigned_long>._M_i != 0)) {
    while ((this->completed).super___atomic_base<unsigned_long>._M_i < iVar4 * iVar5) {
      sched_yield();
    }
    LOCK();
    paVar1 = &this->next_left;
    uVar7 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if (uVar7 < (this->left_outers).super___atomic_base<unsigned_long>._M_i) {
      b1 = 0;
      ::std::__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>::reset
                ((__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_> *)
                 &lstate->joiner,(pointer)0x0);
      ::std::unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>::~unique_ptr
                ((unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_> *)&b1);
      lstate->left_block_index = uVar7;
      pvVar6 = vector<unsigned_long,_true>::get<true>(&this->left_bases,uVar7);
      vVar2 = *pvVar6;
      lstate->left_base = vVar2;
      lstate->left_matches =
           (this_00->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
           super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
           super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
           super__Head_base<0UL,_bool_*,_false>._M_head_impl + vVar2;
      lstate->outer_idx = 0;
      this_01 = this_00;
    }
    else {
      lstate->left_matches = (bool *)0x0;
      LOCK();
      paVar1 = &this->next_right;
      uVar7 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      if ((this->right_outers).super___atomic_base<unsigned_long>._M_i <= uVar7) {
        lstate->right_matches = (bool *)0x0;
        return;
      }
      b1 = 0;
      ::std::__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>::reset
                ((__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_> *)
                 &lstate->joiner,(pointer)0x0);
      ::std::unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>::~unique_ptr
                ((unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_> *)&b1);
      lstate->right_block_index = uVar7;
      pvVar6 = vector<unsigned_long,_true>::get<true>(&this->right_bases,uVar7);
      vVar2 = *pvVar6;
      lstate->right_base = vVar2;
      lstate->right_matches =
           (this_01->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
           super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
           super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
           super__Head_base<0UL,_bool_*,_false>._M_head_impl + vVar2;
      lstate->outer_idx = 0;
    }
    iVar4 = PhysicalRangeJoin::GlobalSortedTable::BlockSize(this_01,uVar7);
    lstate->outer_count = iVar4;
  }
  return;
}

Assistant:

void GetNextPair(ClientContext &client, IEJoinLocalSourceState &lstate) {
		auto &left_table = *gsink.tables[0];
		auto &right_table = *gsink.tables[1];

		const auto left_blocks = left_table.BlockCount();
		const auto right_blocks = right_table.BlockCount();
		const auto pair_count = left_blocks * right_blocks;

		// Regular block
		const auto i = next_pair++;
		if (i < pair_count) {
			const auto b1 = i / right_blocks;
			const auto b2 = i % right_blocks;

			lstate.left_block_index = b1;
			lstate.left_base = left_bases[b1];

			lstate.right_block_index = b2;
			lstate.right_base = right_bases[b2];

			lstate.joiner = make_uniq<IEJoinUnion>(client, op, left_table, b1, right_table, b2);
			return;
		}

		// Outer joins
		if (!left_outers && !right_outers) {
			return;
		}

		// Spin wait for regular blocks to finish(!)
		while (completed < pair_count) {
			std::this_thread::yield();
		}

		// Left outer blocks
		const auto l = next_left++;
		if (l < left_outers) {
			lstate.joiner = nullptr;
			lstate.left_block_index = l;
			lstate.left_base = left_bases[l];

			lstate.left_matches = left_table.found_match.get() + lstate.left_base;
			lstate.outer_idx = 0;
			lstate.outer_count = left_table.BlockSize(l);
			return;
		} else {
			lstate.left_matches = nullptr;
		}

		// Right outer block
		const auto r = next_right++;
		if (r < right_outers) {
			lstate.joiner = nullptr;
			lstate.right_block_index = r;
			lstate.right_base = right_bases[r];

			lstate.right_matches = right_table.found_match.get() + lstate.right_base;
			lstate.outer_idx = 0;
			lstate.outer_count = right_table.BlockSize(r);
			return;
		} else {
			lstate.right_matches = nullptr;
		}
	}